

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkDfsSeq(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pAVar1;
  int iVar2;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    Abc_NtkIncrementTravId(pNtk);
    vNodes = Vec_PtrAlloc(100);
    for (iVar2 = 0; iVar2 < pNtk->vPos->nSize; iVar2 = iVar2 + 1) {
      pAVar1 = Abc_NtkPo(pNtk,iVar2);
      Abc_NtkDfsSeq_rec(pAVar1,vNodes);
    }
    for (iVar2 = 0; iVar2 < pNtk->vPis->nSize; iVar2 = iVar2 + 1) {
      pAVar1 = Abc_NtkPi(pNtk,iVar2);
      Abc_NtkDfsSeq_rec(pAVar1,vNodes);
    }
    return vNodes;
  }
  __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                ,0x1b1,"Vec_Ptr_t *Abc_NtkDfsSeq(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsSeq( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    assert( !Abc_NtkIsNetlist(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDfsSeq_rec( pObj, vNodes );
    // mark the PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDfsSeq_rec( pObj, vNodes );
    return vNodes;
}